

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O3

Vec_Int_t * Acb_NtkFindRoots(Acb_Ntk_t *p,Vec_Int_t *vTargets,Vec_Bit_t **pvBlock)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *p_00;
  int *piVar3;
  Vec_Bit_t *vBlock;
  long lVar4;
  long lVar5;
  int iVar6;
  size_t __size;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  piVar3 = (int *)malloc(4000);
  p_00->pArray = piVar3;
  uVar2 = (p->vObjType).nSize - 1;
  iVar6 = (((int)uVar2 >> 5) + 1) - (uint)((uVar2 & 0x1f) == 0);
  vBlock = (Vec_Bit_t *)malloc(0x10);
  vBlock->nCap = iVar6 * 0x20;
  if (iVar6 == 0) {
    __size = 0;
    piVar3 = (int *)0x0;
  }
  else {
    __size = (long)iVar6 << 2;
    piVar3 = (int *)malloc(__size);
  }
  vBlock->pArray = piVar3;
  vBlock->nSize = iVar6 * 0x20;
  memset(piVar3,0,__size);
  *pvBlock = vBlock;
  if ((p->vObjTrav).nSize < 1) {
    uVar2 = (p->vObjType).nCap;
    if ((p->vObjTrav).nCap < (int)uVar2) {
      piVar3 = (p->vObjTrav).pArray;
      if (piVar3 == (int *)0x0) {
        piVar3 = (int *)malloc((long)(int)uVar2 << 2);
      }
      else {
        piVar3 = (int *)realloc(piVar3,(long)(int)uVar2 << 2);
      }
      (p->vObjTrav).pArray = piVar3;
      if (piVar3 == (int *)0x0) goto LAB_00394cfc;
      (p->vObjTrav).nCap = uVar2;
    }
    if (0 < (int)uVar2) {
      memset((p->vObjTrav).pArray,0,(ulong)uVar2 * 4);
    }
    (p->vObjTrav).nSize = uVar2;
  }
  p->nObjTravs = p->nObjTravs + 1;
  if (vTargets->nSize < 1) {
    __assert_fail("Vec_IntSize(vTargets) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbFunc.c"
                  ,0x200,"Vec_Int_t *Acb_NtkFindRoots(Acb_Ntk_t *, Vec_Int_t *, Vec_Bit_t **)");
  }
  piVar3 = vTargets->pArray;
  lVar5 = 0;
  do {
    uVar2 = piVar3[lVar5];
    if (((long)(int)uVar2 < 0) || ((p->vObjTrav).nSize <= (int)uVar2)) goto LAB_00394c42;
    (p->vObjTrav).pArray[(int)uVar2] = p->nObjTravs;
    if (vBlock->nSize <= (int)uVar2) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecBit.h"
                    ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
    }
    vBlock->pArray[uVar2 >> 5] = vBlock->pArray[uVar2 >> 5] | 1 << ((byte)uVar2 & 0x1f);
    lVar5 = lVar5 + 1;
  } while (lVar5 < vTargets->nSize);
  if ((p->vObjTrav).nSize < 1) {
    uVar2 = (p->vObjType).nCap;
    if ((p->vObjTrav).nCap < (int)uVar2) {
      piVar3 = (p->vObjTrav).pArray;
      if (piVar3 == (int *)0x0) {
        piVar3 = (int *)malloc((long)(int)uVar2 << 2);
      }
      else {
        piVar3 = (int *)realloc(piVar3,(long)(int)uVar2 << 2);
      }
      (p->vObjTrav).pArray = piVar3;
      if (piVar3 == (int *)0x0) {
LAB_00394cfc:
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (p->vObjTrav).nCap = uVar2;
    }
    if (0 < (int)uVar2) {
      memset((p->vObjTrav).pArray,0,(ulong)uVar2 * 4);
    }
    (p->vObjTrav).nSize = uVar2;
  }
  iVar6 = p->nObjTravs + 1;
  p->nObjTravs = iVar6;
  if (0 < (p->vCis).nSize) {
    piVar3 = (p->vCis).pArray;
    lVar5 = 0;
    do {
      iVar1 = piVar3[lVar5];
      if (((long)iVar1 < 0) || ((p->vObjTrav).nSize <= iVar1)) goto LAB_00394c42;
      (p->vObjTrav).pArray[iVar1] = iVar6;
      lVar5 = lVar5 + 1;
    } while (lVar5 < (p->vCis).nSize);
  }
  iVar6 = (p->vObjType).nSize;
  if (1 < iVar6) {
    lVar5 = 1;
    do {
      lVar4 = (long)iVar6;
      if (lVar4 <= lVar5) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      uVar2 = (uint)(byte)(p->vObjType).pArray[lVar5];
      if ((4 < uVar2) || ((0x19U >> (uVar2 & 0x1f) & 1) == 0)) {
        Acb_NtkFindRoots_rec(p,(int)lVar5,vBlock);
        iVar6 = (p->vObjType).nSize;
        lVar4 = (long)iVar6;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < lVar4);
  }
  if (0 < (p->vCos).nSize) {
    lVar5 = 0;
    do {
      iVar6 = (p->vCos).pArray[lVar5];
      if ((long)iVar6 < 1) {
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                      ,0xfe,"int Acb_ObjFanOffset(Acb_Ntk_t *, int)");
      }
      if ((p->vObjFans).nSize <= iVar6) {
LAB_00394c42:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar6 = (p->vObjFans).pArray[iVar6];
      if (((long)iVar6 < 0) || ((p->vFanSto).nSize <= iVar6)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      iVar6 = Acb_NtkFindRoots_rec(p,(p->vFanSto).pArray[(long)iVar6 + 1],vBlock);
      if (iVar6 != 0) {
        Vec_IntPush(p_00,(int)lVar5);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < (p->vCos).nSize);
  }
  return p_00;
}

Assistant:

Vec_Int_t * Acb_NtkFindRoots( Acb_Ntk_t * p, Vec_Int_t * vTargets, Vec_Bit_t ** pvBlock )
{
    int i, iObj;
    Vec_Int_t * vRoots = Vec_IntAlloc( 1000 );
    Vec_Bit_t * vBlock = Vec_BitStart( Acb_NtkObjNum(p) );
    *pvBlock = vBlock;
    // mark targets
    Acb_NtkIncTravId( p );
    assert( Vec_IntSize(vTargets) > 0 );
    Vec_IntForEachEntry( vTargets, iObj, i )
    {
        Acb_ObjSetTravIdCur( p, iObj );
        Vec_BitWriteEntry( vBlock, iObj, 1 );
    }
    // mark inputs
    Acb_NtkIncTravId( p );
    Acb_NtkForEachCi( p, iObj, i )
        Acb_ObjSetTravIdCur( p, iObj );
    // visit internal nodes
    Acb_NtkForEachNode( p, iObj )
        Acb_NtkFindRoots_rec(p, iObj, vBlock);
    // collect outputs reachable from targets
    Acb_NtkForEachCoDriver( p, iObj, i )
        if ( Acb_NtkFindRoots_rec(p, iObj, vBlock) )
            Vec_IntPush( vRoots, i );
    //Vec_IntPrint( vRoots );
    return vRoots;
}